

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O0

double __thiscall PhaseGenerator::getPhase(PhaseGenerator *this,OPL3 *OPL3,int vib)

{
  int vib_local;
  OPL3 *OPL3_local;
  PhaseGenerator *this_local;
  
  if (vib == 1) {
    this->phase = this->phaseIncrement *
                  ::OPL3::OPL3Data->vibratoTable[OPL3->dvb][OPL3->vibratoIndex] + this->phase;
  }
  else {
    this->phase = this->phaseIncrement + this->phase;
  }
  return this->phase;
}

Assistant:

double PhaseGenerator::getPhase(OPL3 *OPL3, int vib) {
	if(vib==1) 
		// phaseIncrement = (operatorFrequency * vibrato) / OPL_SAMPLE_RATE
		phase += phaseIncrement*OPL3::OPL3Data->vibratoTable[OPL3->dvb][OPL3->vibratoIndex];
	else 
		// phaseIncrement = operatorFrequency / OPL_SAMPLE_RATE
		phase += phaseIncrement;
	// Originally clamped phase to [0,1), but that's not needed
	return phase;
}